

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imagecodec.hpp
# Opt level: O2

vec4 ImageCodec::decodeFLOAT_UINTPacked<unsigned_int>(ImageCodec *codec,void *ptr)

{
  byte bVar1;
  uint uVar2;
  pointer pSVar3;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 aVar4;
  uint uVar5;
  float *pfVar6;
  size_t i;
  ulong uVar7;
  long lVar8;
  anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3 local_48;
  
  local_48._0_8_ = 0;
  local_48._8_8_ = 0x3f80000000000000;
  lVar8 = 8;
  for (uVar7 = 0;
      pSVar3 = (codec->packedSampleInfo).
               super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>.
               _M_impl.super__Vector_impl_data._M_start,
      uVar7 < (ulong)(((long)(codec->packedSampleInfo).
                             super__Vector_base<ImageCodec::SampleInfo,_std::allocator<ImageCodec::SampleInfo>_>
                             ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar3) / 0xc);
      uVar7 = uVar7 + 1) {
    uVar5 = ~(-1 << (*(byte *)((long)&pSVar3->elementIndex + lVar8) & 0x1f));
    uVar2 = *(uint *)((long)ptr + (ulong)*(uint *)((long)pSVar3 + lVar8 + -8) * 4);
    bVar1 = *(byte *)((long)pSVar3 + lVar8 + -4);
    pfVar6 = glm::vec<4,_float,_(glm::precision)0>::operator[]
                       ((vec<4,_float,_(glm::precision)0> *)&local_48.field_0,(length_type)uVar7);
    *pfVar6 = (float)(int)(uVar2 >> (bVar1 & 0x1f) & uVar5) / (float)(int)uVar5;
    lVar8 = lVar8 + 0xc;
  }
  aVar4._8_8_ = local_48._8_8_;
  aVar4._0_8_ = local_48._0_8_;
  return (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)
         (anon_union_16_4_ea85571f_for_vec<4,_float,_(glm::precision)0>_3)aVar4.field_0;
}

Assistant:

static glm::vec4 decodeFLOAT_UINTPacked(const ImageCodec* codec, const void* ptr) {
        static_assert(std::is_unsigned_v<TYPE>);
        auto data = reinterpret_cast<const TYPE*>(ptr);
        glm::vec4 result(0.f, 0.f, 0.f, 1.f);
        for (std::size_t i = 0; i < codec->packedSampleInfo.size(); ++i) {
            const auto& info = codec->packedSampleInfo[i];
            const auto upper = static_cast<float>((1u << info.bitLength) - 1u);
            uint32_t rawValue = (data[info.elementIndex] >> info.bitOffset) & ((1u << info.bitLength) - 1u);
            result[static_cast<glm::length_t>(i)] = static_cast<float>(rawValue) / upper;
        }
        return result;
    }